

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cv_test.c
# Opt level: O3

void test_cv_producer_consumer0(testing t)

{
  cv_queue *q;
  closure *cl;
  int count;
  int start;
  
  q = (cv_queue *)calloc(1,0x48);
  q->limit = 1;
  cl = (closure *)malloc(0x28);
  cl->f0 = closure_f0_producer_cv_n;
  cl[1].f0 = producer_cv_n;
  cl[2].f0 = (_func_void_void_ptr *)t;
  cl[3].f0 = (_func_void_void_ptr *)q;
  count = 0;
  cl[4].f0 = (_func_void_void_ptr *)0x186a000000000;
  closure_fork(cl);
  consumer_cv_n(t,q,start,count);
  free(q);
  return;
}

Assistant:

static void test_cv_producer_consumer0 (testing t) {
	cv_queue *q = cv_queue_new (1);
	closure_fork (closure_producer_cv_n (&producer_cv_n, t, q, 0, CV_PRODUCER_CONSUMER_N));
	consumer_cv_n (t, q, 0, CV_PRODUCER_CONSUMER_N);
	free (q);
}